

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O1

double TasGrid::RuleLocal::getNode<(TasGrid::RuleLocal::erule)1>(int point)

{
  int result;
  int iVar1;
  uint uVar2;
  
  if ((uint)point < 3) {
    return *(double *)(&DAT_001d08e0 + (ulong)(uint)point * 8);
  }
  uVar2 = point - 1;
  iVar1 = 1;
  do {
    uVar2 = (int)uVar2 >> 1;
    iVar1 = iVar1 * 2;
  } while (1 < uVar2);
  return (double)(point * 2 + -1) / (double)iVar1 + -3.0;
}

Assistant:

double getNode(int point) {
        switch(effective_rule) {
            case erule::pwc:
                return -2.0 + (1.0 / ((double) Maths::int3log3(point))) * (3*point + 2 - point % 2);
            case erule::localp:
            case erule::semilocalp:
                switch(point) {
                    case 0: return  0.0;
                    case 1: return -1.0;
                    case 2: return  1.0;
                    default:
                        return ((double)(2*point - 1)) / ((double) Maths::int2log2(point - 1)) - 3.0;
                };
            case erule::localp0:
                return ((double)(2*point + 3) ) / ((double) Maths::int2log2(point + 1) ) - 3.0;
            default: // case erule::localpb:
                switch(point) {
                    case 0: return -1.0;
                    case 1: return  1.0;
                    case 2: return  0.0;
                    default:
                        return ((double)(2*point - 1)) / ((double) Maths::int2log2(point - 1)) - 3.0;
                };
        };
    }